

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall cli::Parser::~Parser(Parser *this)

{
  CmdBase *pCVar1;
  pointer ppCVar2;
  pointer pcVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)((long)(this->_commands).
                               super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_commands).
                              super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pCVar1 = (this->_commands).
               super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      if (pCVar1 != (CmdBase *)0x0) {
        (*pCVar1->_vptr_CmdBase[1])();
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  ppCVar2 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_arguments);
  pcVar3 = (this->_appname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->_appname).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

~Parser() {
			for (int i = 0, n = _commands.size(); i < n; ++i) {
				delete _commands[i];
			}
		}